

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void emit_ARB1_dest_modifiers(Context *ctx)

{
  int iVar1;
  char local_128 [8];
  char dst_1 [64];
  char var_1 [64];
  char var [64];
  char *local_60;
  char *multiplier;
  char dst [64];
  DestArgInfo *arg;
  Context *ctx_local;
  
  dst._56_8_ = &ctx->dest_arg;
  if ((ctx->dest_arg).result_shift != 0) {
    make_ARB1_destarg_string(ctx,(char *)&multiplier,0x40);
    local_60 = (char *)0x0;
    switch(*(undefined4 *)(dst._56_8_ + 0x2c)) {
    case 1:
      local_60 = "2.0";
      break;
    case 2:
      local_60 = "4.0";
      break;
    case 3:
      local_60 = "8.0";
      break;
    case 0xd:
      local_60 = "0.125";
      break;
    case 0xe:
      local_60 = "0.25";
      break;
    case 0xf:
      local_60 = "0.5";
    }
    if (local_60 != (char *)0x0) {
      get_ARB1_destarg_varname(ctx,var_1 + 0x38,0x40);
      output_line(ctx,"MUL%s, %s, %s;",&multiplier,var_1 + 0x38,local_60);
    }
  }
  if ((((*(uint *)(dst._56_8_ + 0x28) & 1) != 0) && (ctx->profile_supports_nv4 == 0)) &&
     (iVar1 = shader_is_pixel(ctx), iVar1 == 0)) {
    get_ARB1_destarg_varname(ctx,dst_1 + 0x38,0x40);
    make_ARB1_destarg_string(ctx,local_128,0x40);
    output_line(ctx,"MIN%s, %s, 1.0;",local_128,dst_1 + 0x38);
    output_line(ctx,"MAX%s, %s, 0.0;",local_128,dst_1 + 0x38);
  }
  return;
}

Assistant:

static void emit_ARB1_dest_modifiers(Context *ctx)
{
    const DestArgInfo *arg = &ctx->dest_arg;

    if (arg->result_shift != 0x0)
    {
        char dst[64]; make_ARB1_destarg_string(ctx, dst, sizeof (dst));
        const char *multiplier = NULL;

        switch (arg->result_shift)
        {
            case 0x1: multiplier = "2.0"; break;
            case 0x2: multiplier = "4.0"; break;
            case 0x3: multiplier = "8.0"; break;
            case 0xD: multiplier = "0.125"; break;
            case 0xE: multiplier = "0.25"; break;
            case 0xF: multiplier = "0.5"; break;
        } // switch

        if (multiplier != NULL)
        {
            char var[64]; get_ARB1_destarg_varname(ctx, var, sizeof (var));
            output_line(ctx, "MUL%s, %s, %s;", dst, var, multiplier);
        } // if
    } // if

    if (arg->result_mod & MOD_SATURATE)
    {
        // nv4 and/or pixel shaders just used the "SAT" modifier, instead.
        if ( (!support_nv4(ctx)) && (!shader_is_pixel(ctx)) )
        {
            char var[64]; get_ARB1_destarg_varname(ctx, var, sizeof (var));
            char dst[64]; make_ARB1_destarg_string(ctx, dst, sizeof (dst));
            output_line(ctx, "MIN%s, %s, 1.0;", dst, var);
            output_line(ctx, "MAX%s, %s, 0.0;", dst, var);
        } // if
    } // if
}